

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < (this->Fonts).Size; lVar1 = lVar1 + 1) {
    IM_DELETE<ImFont>((this->Fonts).Data[lVar1]);
  }
  ImVector<ImFont_*>::clear(&this->Fonts);
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}